

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyContainer.hh
# Opt level: O0

PropertyT<OpenMesh::Attributes::StatusInfo> * __thiscall
OpenMesh::PropertyContainer::property<OpenMesh::Attributes::StatusInfo>
          (PropertyContainer *this,BasePropHandleT<OpenMesh::Attributes::StatusInfo> _h)

{
  int iVar1;
  reference ppBVar2;
  long in_RDI;
  BaseHandle local_4;
  
  iVar1 = BaseHandle::idx(&local_4);
  ppBVar2 = std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>::
            operator[]((vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>
                        *)(in_RDI + 8),(long)iVar1);
  return (PropertyT<OpenMesh::Attributes::StatusInfo> *)*ppBVar2;
}

Assistant:

PropertyT<T>& property(BasePropHandleT<T> _h)
  {
    assert(_h.idx() >= 0 && _h.idx() < (int)properties_.size());
    assert(properties_[_h.idx()] != NULL);
#ifdef OM_FORCE_STATIC_CAST
    return *static_cast  <PropertyT<T>*> (properties_[_h.idx()]);
#else
    PropertyT<T>* p = dynamic_cast<PropertyT<T>*>(properties_[_h.idx()]);
    assert(p != NULL);
    return *p;
#endif
  }